

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_Truth4VarNPN(unsigned_short **puCanons,char **puPhases,char **puPerms,uchar **puMap)

{
  uchar uVar1;
  byte bVar2;
  int v;
  int iVar3;
  uint uVar4;
  uint uVar5;
  unsigned_short *__ptr;
  char *__ptr_00;
  char *__ptr_01;
  uchar *__ptr_02;
  char **__ptr_03;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  byte bVar9;
  int iVar10;
  uint *puVar11;
  uint uVar12;
  unsigned_short uVar13;
  ulong uVar14;
  
  uVar14 = 1;
  __ptr = (unsigned_short *)calloc(1,0x20000);
  __ptr_00 = (char *)calloc(1,0x10000);
  __ptr_01 = (char *)calloc(1,0x10000);
  __ptr_02 = (uchar *)calloc(1,0x10000);
  __ptr_03 = Extra_Permutations(4);
  iVar3 = 1;
  do {
    uVar8 = (ulong)__ptr[uVar14];
    if (uVar8 == 0) {
      iVar10 = iVar3 + 1;
      __ptr_02[uVar14] = (uchar)iVar3;
      uVar12 = 0;
      do {
        puVar11 = Extra_TruthPolarize::Signs;
        lVar6 = 0;
        uVar8 = uVar14 & 0xffffffff;
        do {
          if ((uVar12 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
            bVar2 = (byte)(1 << ((byte)lVar6 & 0x1f));
            uVar8 = (ulong)((*puVar11 & (uint)uVar8) >> (bVar2 & 0x1f) |
                           (~*puVar11 & (uint)uVar8) << (bVar2 & 0x1f));
          }
          lVar6 = lVar6 + 1;
          puVar11 = puVar11 + 1;
        } while (lVar6 != 4);
        bVar2 = (byte)uVar12;
        lVar6 = 0;
        do {
          uVar4 = Extra_TruthPermute((uint)uVar8,__ptr_03[lVar6],4,0);
          uVar13 = (unsigned_short)uVar14;
          if ((ulong)__ptr[uVar4] == 0) {
            __ptr[uVar4] = uVar13;
            __ptr_00[uVar4] = bVar2;
            __ptr_01[uVar4] = (char)lVar6;
            uVar7 = (ulong)(ushort)uVar4 ^ 0xffff;
            __ptr[uVar7] = uVar13;
            __ptr_00[uVar7] = bVar2 | 0x10;
            __ptr_01[uVar7] = (char)lVar6;
          }
          else if (uVar14 != __ptr[uVar4]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                          ,0x2b5,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x18);
        puVar11 = Extra_TruthPolarize::Signs;
        lVar6 = 0;
        uVar4 = (uint)uVar14 ^ 0xffff;
        do {
          if ((uVar12 >> ((uint)lVar6 & 0x1f) & 1) != 0) {
            bVar9 = (byte)(1 << ((byte)lVar6 & 0x1f));
            uVar4 = (*puVar11 & uVar4) >> (bVar9 & 0x1f) | (~*puVar11 & uVar4) << (bVar9 & 0x1f);
          }
          lVar6 = lVar6 + 1;
          puVar11 = puVar11 + 1;
        } while (lVar6 != 4);
        lVar6 = 0;
        do {
          uVar5 = Extra_TruthPermute(uVar4,__ptr_03[lVar6],4,0);
          if ((ulong)__ptr[uVar5] == 0) {
            __ptr[uVar5] = uVar13;
            __ptr_00[uVar5] = bVar2;
            __ptr_01[uVar5] = (char)lVar6;
            uVar8 = (ulong)(ushort)uVar5 ^ 0xffff;
            __ptr[uVar8] = uVar13;
            __ptr_00[uVar8] = bVar2 | 0x10;
            __ptr_01[uVar8] = (char)lVar6;
          }
          else if (uVar14 != __ptr[uVar5]) {
            __assert_fail("uCanons[uPerm] == uTruth",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                          ,0x2c7,
                          "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                         );
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x18);
        uVar12 = uVar12 + 1;
        iVar3 = iVar10;
      } while (uVar12 != 0x10);
    }
    else {
      if (uVar14 <= uVar8) {
        __assert_fail("uTruth > uCanons[uTruth]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x29e,
                      "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)"
                     );
      }
      uVar1 = __ptr_02[uVar8];
      __ptr_02[uVar14] = uVar1;
      __ptr_02[uVar14 & 0xffffffff ^ 0xffff] = uVar1;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x8000);
  __ptr_00[0xffff] = '\x10';
  if (iVar3 != 0xde) {
    __assert_fail("nClasses == 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0x2cc,
                  "void Extra_Truth4VarNPN(unsigned short **, char **, char **, unsigned char **)");
  }
  if (__ptr_03 != (char **)0x0) {
    free(__ptr_03);
  }
  if (puCanons == (unsigned_short **)0x0) {
    free(__ptr);
  }
  else {
    *puCanons = __ptr;
  }
  if (puPhases == (char **)0x0) {
    free(__ptr_00);
  }
  else {
    *puPhases = __ptr_00;
  }
  if (puPerms == (char **)0x0) {
    if (__ptr_01 != (char *)0x0) {
      free(__ptr_01);
    }
  }
  else {
    *puPerms = __ptr_01;
  }
  if (puMap == (uchar **)0x0) {
    if (__ptr_02 != (uchar *)0x0) {
      free(__ptr_02);
      return;
    }
  }
  else {
    *puMap = __ptr_02;
  }
  return;
}

Assistant:

void Extra_Truth4VarNPN( unsigned short ** puCanons, char ** puPhases, char ** puPerms, unsigned char ** puMap )
{
    unsigned short * uCanons;
    unsigned char * uMap;
    unsigned uTruth, uPhase, uPerm;
    char ** pPerms4, * uPhases, * uPerms;
    int nFuncs, nClasses;
    int i, k;

    nFuncs  = (1 << 16);
    uCanons = ABC_ALLOC( unsigned short, nFuncs );
    uPhases = ABC_ALLOC( char, nFuncs );
    uPerms  = ABC_ALLOC( char, nFuncs );
    uMap    = ABC_ALLOC( unsigned char, nFuncs );
    memset( uCanons, 0, sizeof(unsigned short) * nFuncs );
    memset( uPhases, 0, sizeof(char) * nFuncs );
    memset( uPerms,  0, sizeof(char) * nFuncs );
    memset( uMap,    0, sizeof(unsigned char) * nFuncs );
    pPerms4 = Extra_Permutations( 4 );

    nClasses = 1;
    nFuncs = (1 << 15);
    for ( uTruth = 1; uTruth < (unsigned)nFuncs; uTruth++ )
    {
        // skip already assigned
        if ( uCanons[uTruth] )
        {
            assert( uTruth > uCanons[uTruth] );
            uMap[~uTruth & 0xFFFF] = uMap[uTruth] = uMap[uCanons[uTruth]];
            continue;
        }
        uMap[uTruth] = nClasses++;
        for ( i = 0; i < 16; i++ )
        {
            uPhase = Extra_TruthPolarize( uTruth, i, 4 );
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
            uPhase = Extra_TruthPolarize( ~uTruth & 0xFFFF, i, 4 ); 
            for ( k = 0; k < 24; k++ )
            {
                uPerm = Extra_TruthPermute( uPhase, pPerms4[k], 4, 0 );
                if ( uCanons[uPerm] == 0 )
                {
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i;
                    uPerms[uPerm]  = k;

                    uPerm = ~uPerm & 0xFFFF;
                    uCanons[uPerm] = uTruth;
                    uPhases[uPerm] = i | 16;
                    uPerms[uPerm]  = k;
                }
                else
                    assert( uCanons[uPerm] == uTruth );
            }
        }
    }
    uPhases[(1<<16)-1] = 16;
    assert( nClasses == 222 );
    ABC_FREE( pPerms4 );
    if ( puCanons ) 
        *puCanons = uCanons;
    else
        ABC_FREE( uCanons );
    if ( puPhases ) 
        *puPhases = uPhases;
    else
        ABC_FREE( uPhases );
    if ( puPerms ) 
        *puPerms = uPerms;
    else
        ABC_FREE( uPerms );
    if ( puMap ) 
        *puMap = uMap;
    else
        ABC_FREE( uMap );
}